

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

int ikcp_setmtu(ikcpcb *kcp,int mtu)

{
  char *pcVar1;
  char *buffer;
  int mtu_local;
  ikcpcb *kcp_local;
  
  if ((mtu < 0x32) || (mtu < 0x18)) {
    kcp_local._4_4_ = -1;
  }
  else {
    pcVar1 = (char *)ikcp_malloc((ulong)(uint)((mtu + 0x18) * 3));
    if (pcVar1 == (char *)0x0) {
      kcp_local._4_4_ = -2;
    }
    else {
      kcp->mtu = mtu;
      kcp->mss = kcp->mtu - 0x18;
      ikcp_free(kcp->buffer);
      kcp->buffer = pcVar1;
      kcp_local._4_4_ = 0;
    }
  }
  return kcp_local._4_4_;
}

Assistant:

int ikcp_setmtu(ikcpcb *kcp, int mtu)
{
	char *buffer;
	if (mtu < 50 || mtu < (int)IKCP_OVERHEAD) 
		return -1;
	buffer = (char*)ikcp_malloc((mtu + IKCP_OVERHEAD) * 3);
	if (buffer == NULL) 
		return -2;
	kcp->mtu = mtu;
	kcp->mss = kcp->mtu - IKCP_OVERHEAD;
	ikcp_free(kcp->buffer);
	kcp->buffer = buffer;
	return 0;
}